

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O2

void __thiscall Sample::Sample(Sample *this,char *filename)

{
  ALLEGRO_SAMPLE *pAVar1;
  allocator<char> local_39;
  string local_38 [32];
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  pAVar1 = (ALLEGRO_SAMPLE *)al_load_sample(filename);
  this->spl = pAVar1;
  std::__cxx11::string::string<std::allocator<char>>(local_38,filename,&local_39);
  basename((char *)local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

Sample::Sample(char const *filename)
{
   spl = al_load_sample(filename);
   basename(filename, this->filename);
}